

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool run_container_is_subset(run_container_t *container1,run_container_t *container2)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  iVar3 = 0;
  iVar4 = 0;
  do {
    if ((container1->n_runs <= iVar4) || (container2->n_runs <= iVar3)) {
      return iVar4 == container1->n_runs;
    }
    uVar1 = container1->runs[iVar4].value;
    uVar2 = container2->runs[iVar3].value;
    if (uVar2 <= uVar1) {
      uVar5 = (uint)container1->runs[iVar4].length + (uint)uVar1;
      uVar6 = (uint)container2->runs[iVar3].length + (uint)uVar2;
      if (uVar5 < uVar6) {
        iVar4 = iVar4 + 1;
      }
      else {
        if (uVar5 == uVar6) {
          iVar4 = iVar4 + 1;
        }
        iVar3 = iVar3 + 1;
      }
    }
  } while (uVar2 <= uVar1);
  return false;
}

Assistant:

bool run_container_is_subset(const run_container_t *container1,
                             const run_container_t *container2) {
    int i1 = 0, i2 = 0;
    while (i1 < container1->n_runs && i2 < container2->n_runs) {
        int start1 = container1->runs[i1].value;
        int stop1 = start1 + container1->runs[i1].length;
        int start2 = container2->runs[i2].value;
        int stop2 = start2 + container2->runs[i2].length;
        if (start1 < start2) {
            return false;
        } else {  // start1 >= start2
            if (stop1 < stop2) {
                i1++;
            } else if (stop1 == stop2) {
                i1++;
                i2++;
            } else {  // stop1 > stop2
                i2++;
            }
        }
    }
    if (i1 == container1->n_runs) {
        return true;
    } else {
        return false;
    }
}